

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Select * sqlite3SelectDup(sqlite3 *db,Select *pDup,int flags)

{
  int *piVar1;
  With *pWVar2;
  int iVar3;
  anon_union_8_14_c5524298_for_u p;
  ExprList *pEVar4;
  SrcList *pSVar5;
  Expr *pEVar6;
  With *pWVar7;
  Select *pSVar8;
  char *pcVar9;
  Parse *pPVar10;
  anon_union_8_14_c5524298_for_u *paVar11;
  Walker *pWVar12;
  anon_union_8_14_c5524298_for_u aVar13;
  Window *p_00;
  long lVar14;
  long lVar15;
  Select *pRet;
  Walker local_60;
  
  pRet = (Select *)0x0;
  paVar11 = (anon_union_8_14_c5524298_for_u *)&pRet;
  aVar13.pNC = (NameContext *)0x0;
  do {
    if ((pDup == (Select *)0x0) ||
       (p.pNC = (NameContext *)sqlite3DbMallocRawNN(db,0x80), (Select *)p.pNC == (Select *)0x0)) {
      return pRet;
    }
    pEVar4 = sqlite3ExprListDup(db,pDup->pEList,flags);
    (p.pSelect)->pEList = pEVar4;
    pSVar5 = sqlite3SrcListDup(db,pDup->pSrc,flags);
    (p.pSelect)->pSrc = pSVar5;
    pEVar6 = sqlite3ExprDup(db,pDup->pWhere,flags);
    (p.pSelect)->pWhere = pEVar6;
    pEVar4 = sqlite3ExprListDup(db,pDup->pGroupBy,flags);
    (p.pSelect)->pGroupBy = pEVar4;
    pEVar6 = sqlite3ExprDup(db,pDup->pHaving,flags);
    (p.pSelect)->pHaving = pEVar6;
    pEVar4 = sqlite3ExprListDup(db,pDup->pOrderBy,flags);
    (p.pSelect)->pOrderBy = pEVar4;
    (p.pSelect)->op = pDup->op;
    (p.pSrcList)->a[0].pUsing = (IdList *)aVar13;
    (p.pSrcList)->a[0].pOn = (Expr *)0x0;
    pEVar6 = sqlite3ExprDup(db,pDup->pLimit,flags);
    (p.pSelect)->pLimit = pEVar6;
    (p.pSrcList)->a[0].zDatabase = (char *)0x0;
    (p.pSelect)->selFlags = pDup->selFlags & 0xffffffdf;
    piVar1 = (int *)((long)&(p.pNC)->pNext + 4);
    piVar1[0] = -1;
    piVar1[1] = -1;
    (p.pSelect)->nSelectRow = pDup->nSelectRow;
    pWVar2 = pDup->pWith;
    if ((pWVar2 == (With *)0x0) ||
       (pWVar7 = (With *)sqlite3DbMallocZero(db,(long)pWVar2->nCte << 5 | 0x10),
       pWVar7 == (With *)0x0)) {
      pWVar7 = (With *)0x0;
    }
    else {
      iVar3 = pWVar2->nCte;
      pWVar7->nCte = iVar3;
      lVar14 = 0x20;
      for (lVar15 = 0; lVar15 < iVar3; lVar15 = lVar15 + 1) {
        pSVar8 = sqlite3SelectDup(db,*(Select **)((long)pWVar2->a + lVar14 + -0x10),0);
        *(Select **)((long)pWVar7->a + lVar14 + -0x10) = pSVar8;
        pEVar4 = sqlite3ExprListDup(db,*(ExprList **)((long)pWVar2->a + lVar14 + -0x18),0);
        *(ExprList **)((long)pWVar7->a + lVar14 + -0x18) = pEVar4;
        pcVar9 = sqlite3DbStrDup(db,*(char **)((long)(pWVar2->a + -1) + lVar14));
        *(char **)((long)(pWVar7->a + -1) + lVar14) = pcVar9;
        iVar3 = pWVar2->nCte;
        lVar14 = lVar14 + 0x20;
      }
    }
    (p.pSrcList)->a[0].u1.zIndexedBy = (char *)pWVar7;
    (p.pSrcList)->a[0].pIBIndex = (Index *)0x0;
    p_00 = pDup->pWinDefn;
    local_60.pParse = (Parse *)0x0;
    pWVar12 = &local_60;
    for (; p_00 != (Window *)0x0; p_00 = p_00->pNextWin) {
      pPVar10 = (Parse *)sqlite3WindowDup(db,(Expr *)0x0,p_00);
      pWVar12->pParse = pPVar10;
      if (pPVar10 == (Parse *)0x0) break;
      pWVar12 = (Walker *)&pPVar10->nMem;
    }
    (p.pSelect)->pWinDefn = (Window *)local_60.pParse;
    if (pDup->pWin != (Window *)0x0) {
      local_60.xExprCallback = gatherSelectWindowsCallback;
      local_60.xSelectCallback = gatherSelectWindowsSelectCallback;
      local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_60.pParse = (Parse *)0x0;
      local_60.u.pNC = p.pNC;
      sqlite3WalkSelect(&local_60,p.pSelect);
    }
    (p.pSelect)->selId = pDup->selId;
    paVar11->pSelect = (Select *)p;
    pDup = pDup->pPrior;
    paVar11 = (anon_union_8_14_c5524298_for_u *)&(p.pSrcList)->a[0].pOn;
    aVar13.pNC = p.pNC;
  } while( true );
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectDup(sqlite3 *db, Select *pDup, int flags){
  Select *pRet = 0;
  Select *pNext = 0;
  Select **pp = &pRet;
  Select *p;

  assert( db!=0 );
  for(p=pDup; p; p=p->pPrior){
    Select *pNew = sqlite3DbMallocRawNN(db, sizeof(*p) );
    if( pNew==0 ) break;
    pNew->pEList = sqlite3ExprListDup(db, p->pEList, flags);
    pNew->pSrc = sqlite3SrcListDup(db, p->pSrc, flags);
    pNew->pWhere = sqlite3ExprDup(db, p->pWhere, flags);
    pNew->pGroupBy = sqlite3ExprListDup(db, p->pGroupBy, flags);
    pNew->pHaving = sqlite3ExprDup(db, p->pHaving, flags);
    pNew->pOrderBy = sqlite3ExprListDup(db, p->pOrderBy, flags);
    pNew->op = p->op;
    pNew->pNext = pNext;
    pNew->pPrior = 0;
    pNew->pLimit = sqlite3ExprDup(db, p->pLimit, flags);
    pNew->iLimit = 0;
    pNew->iOffset = 0;
    pNew->selFlags = p->selFlags & ~SF_UsesEphemeral;
    pNew->addrOpenEphm[0] = -1;
    pNew->addrOpenEphm[1] = -1;
    pNew->nSelectRow = p->nSelectRow;
    pNew->pWith = withDup(db, p->pWith);
#ifndef SQLITE_OMIT_WINDOWFUNC
    pNew->pWin = 0;
    pNew->pWinDefn = sqlite3WindowListDup(db, p->pWinDefn);
    if( p->pWin ) gatherSelectWindows(pNew);
#endif
    pNew->selId = p->selId;
    *pp = pNew;
    pp = &pNew->pPrior;
    pNext = pNew;
  }

  return pRet;
}